

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh_ptr.h
# Opt level: O0

ShPtr<HG::SessionImpl>
make_myshared<HG::SessionImpl,void(*)(Session_cb_t*,int),Session_cb_t*>
          (_func_void_Session_cb_t_ptr_int *args,Session_cb_t *args_1)

{
  ShPtrRep *this;
  SessionImpl *this_00;
  Session_cb_t *in_RDX;
  Session_cb_t *args_local_1;
  _func_void_Session_cb_t_ptr_int *args_local;
  
  this = (ShPtrRep *)operator_new(0x10);
  this_00 = (SessionImpl *)operator_new(0x18);
  HG::SessionImpl::SessionImpl(this_00,(SessionHandlerCallerPtr)args_1,in_RDX);
  ShPtrRep::ShPtrRep(this,this_00,1);
  ShPtr<HG::SessionImpl>::ShPtr((ShPtr<HG::SessionImpl> *)args,this);
  return (ShPtr<HG::SessionImpl>)(ShPtrRep *)args;
}

Assistant:

ShPtr<T> make_myshared(Args... args) {
    // Can be optimized to have just one allocation
    return ShPtr<T>(new ShPtrRep(new T(std::forward<Args>(args)...)));
}